

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExternMemberInfo,_false,_false>::push_back
          (FastVector<ExternMemberInfo,_false,_false> *this,ExternMemberInfo *valPtr,uint elem)

{
  uint uVar1;
  ExternMemberInfo *pEVar2;
  ExternMemberInfo *pEVar3;
  uint local_20;
  uint i;
  uint elem_local;
  ExternMemberInfo *valPtr_local;
  FastVector<ExternMemberInfo,_false,_false> *this_local;
  
  if (this->count + elem < this->max) {
    for (local_20 = 0; local_20 < elem; local_20 = local_20 + 1) {
      pEVar3 = valPtr + local_20;
      uVar1 = this->count;
      this->count = uVar1 + 1;
      pEVar2 = this->data + uVar1;
      uVar1 = pEVar3->alignment;
      pEVar2->type = pEVar3->type;
      pEVar2->alignment = uVar1;
      pEVar2->offset = pEVar3->offset;
    }
  }
  else {
    grow_and_add(this,this->count + elem,valPtr,elem);
  }
  return;
}

Assistant:

__forceinline void push_back(const T* valPtr, unsigned elem)
	{
		if(count + elem >= max)
		{
			grow_and_add(count + elem, valPtr, elem);
			return;
		}

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];
	}